

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindowPrivate::QMdiSubWindowPrivate(QMdiSubWindowPrivate *this)

{
  QWidgetPrivate::QWidgetPrivate(&this->super_QWidgetPrivate,QObjectPrivateVersion);
  *(undefined ***)&this->super_QWidgetPrivate = &PTR__QMdiSubWindowPrivate_007f64b8;
  (this->baseWidget).wp = (QWeakPointer<QObject>)0x0;
  (this->restoreFocusWidget).wp = (QWeakPointer<QObject>)0x0;
  (this->controlContainer).wp = (QWeakPointer<QObject>)0x0;
  (this->sizeGrip).wp = (QWeakPointer<QObject>)0x0;
  this->rubberBand = (QRubberBand *)0x0;
  (this->mousePressPosition).xp = 0;
  (this->mousePressPosition).yp = 0;
  (this->oldGeometry).x1 = 0;
  (this->oldGeometry).y1 = 0;
  (this->oldGeometry).x2.m_i = -1;
  (this->oldGeometry).y2.m_i = -1;
  (this->internalMinimumSize).wd.m_i = -1;
  (this->internalMinimumSize).ht.m_i = -1;
  (this->userMinimumSize).wd = 0;
  (this->userMinimumSize).ht = 0;
  (this->restoreSize).wd = -1;
  (this->restoreSize).ht = -1;
  this->resizeEnabled = true;
  this->moveEnabled = true;
  this->isInInteractiveMode = false;
  this->isInRubberBandMode = false;
  this->isShadeMode = false;
  this->ignoreWindowTitleChange = false;
  this->ignoreNextActivationEvent = false;
  this->activationEnabled = true;
  this->isShadeRequestFromMinimizeMode = false;
  this->isMaximizeMode = false;
  this->isWidgetHiddenByUs = false;
  this->isActive = false;
  this->isExplicitlyDeactivated = false;
  this->keyboardSingleStep = 5;
  this->keyboardPageStep = 0x14;
  this->resizeTimer = Invalid;
  this->currentOperation = None;
  this->hoveredSubControl = SC_None;
  this->activeSubControl = SC_None;
  this->focusInReason = ActiveWindowFocusReason;
  (this->lastChildWindowTitle).d.d = (Data *)0x0;
  (this->lastChildWindowTitle).d.ptr = (char16_t *)0x0;
  (this->lastChildWindowTitle).d.size = 0;
  memset(&this->operationMap,0,0x8c);
  QPalette::QPalette(&this->titleBarPalette);
  (this->windowTitle).d.size = 0;
  (this->windowTitle).d.d = (Data *)0x0;
  (this->windowTitle).d.ptr = (char16_t *)0x0;
  QFont::QFont(&this->font);
  QIcon::QIcon(&this->menuIcon);
  QStyleOptionTitleBar::QStyleOptionTitleBar(&this->cachedStyleOptions);
  (this->originalTitle).d.size = 0;
  (this->originalTitle).d.d = (Data *)0x0;
  (this->originalTitle).d.ptr = (char16_t *)0x0;
  initOperationMap(this);
  return;
}

Assistant:

QMdiSubWindowPrivate::QMdiSubWindowPrivate()
    : baseWidget(nullptr),
      restoreFocusWidget(nullptr),
      controlContainer(nullptr),
#if QT_CONFIG(sizegrip)
      sizeGrip(nullptr),
#endif
#if QT_CONFIG(rubberband)
      rubberBand(nullptr),
#endif
      userMinimumSize(0,0),
      resizeEnabled(true),
      moveEnabled(true),
      isInInteractiveMode(false),
#if QT_CONFIG(rubberband)
      isInRubberBandMode(false),
#endif
      isShadeMode(false),
      ignoreWindowTitleChange(false),
      ignoreNextActivationEvent(false),
      activationEnabled(true),
      isShadeRequestFromMinimizeMode(false),
      isMaximizeMode(false),
      isWidgetHiddenByUs(false),
      isActive(false),
      isExplicitlyDeactivated(false),
      keyboardSingleStep(5),
      keyboardPageStep(20),
      currentOperation(None),
      hoveredSubControl(QStyle::SC_None),
      activeSubControl(QStyle::SC_None),
      focusInReason(Qt::ActiveWindowFocusReason)
{
    initOperationMap();
}